

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.h
# Opt level: O2

sc_phash_elem * __thiscall
sc_core::sc_phash_base::find_entry(sc_phash_base *this,uint hv,void *k,sc_phash_elem ***plast)

{
  sc_phash_elem *psVar1;
  
  if (this->cmpr == (cmpr_fn_t)0x0) {
    psVar1 = find_entry_q(this,hv,k,plast);
    return psVar1;
  }
  psVar1 = find_entry_c(this,hv,k,plast);
  return psVar1;
}

Assistant:

sc_phash_elem* find_entry(unsigned hv, const void* k, sc_phash_elem*** plast=0) const
    {
      /* Got rid of member func. pointer and replaced with if-else  */
      /* Amit (5/14/99)                                             */
      if( cmpr == 0 )
        return ((sc_phash_base*)this)->find_entry_q( hv, k, plast );
      else
	return ((sc_phash_base*)this)->find_entry_c( hv, k, plast );
    }